

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::ProgramBinaryCase::verifyProgramBinary
          (ProgramBinaryCase *this,ProgramBinary *binary)

{
  bool bVar1;
  MessageBuilder *pMVar2;
  MessageBuilder local_1a0;
  TestLog *local_20;
  TestLog *log;
  ProgramBinary *binary_local;
  ProgramBinaryCase *this_local;
  
  log = (TestLog *)binary;
  binary_local = (ProgramBinary *)this;
  local_20 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  bVar1 = isFormatSupported(this,*(GLenum *)&log->m_log);
  if (!bVar1) {
    tcu::TestLog::operator<<(&local_1a0,local_20,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<(&local_1a0,(char (*) [23])"Program binary format ");
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(uint *)log);
    pMVar2 = tcu::MessageBuilder::operator<<
                       (pMVar2,(char (*) [62])
                               " is not among the supported formats reported by the platform.");
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a0);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Invalid format");
  }
  return;
}

Assistant:

void ProgramBinaryCase::verifyProgramBinary (ProgramBinary& binary)
{
	TestLog& log = m_testCtx.getLog();

	if (!isFormatSupported(binary.format))
	{
		log << TestLog::Message << "Program binary format " << binary.format << " is not among the supported formats reported by the platform." << TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid format");
	}
}